

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

iterator __thiscall QList<LibrarySearchPath>::begin(QList<LibrarySearchPath> *this)

{
  detach(this);
  return (iterator)(this->d).ptr;
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }